

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O0

void Rtm_ManFree(Rtm_Man_t *p)

{
  Rtm_Man_t *p_local;
  
  Vec_PtrFree(p->vObjs);
  Vec_PtrFree(p->vPis);
  Vec_PtrFree(p->vPos);
  Aig_MmFlexStop(p->pMem,0);
  if (p->pExtra != (uint *)0x0) {
    free(p->pExtra);
    p->pExtra = (uint *)0x0;
  }
  if (p != (Rtm_Man_t *)0x0) {
    free(p);
  }
  return;
}

Assistant:

void Rtm_ManFree( Rtm_Man_t * p )
{
    Vec_PtrFree( p->vObjs );
    Vec_PtrFree( p->vPis );
    Vec_PtrFree( p->vPos );
    Aig_MmFlexStop( p->pMem, 0 );
    ABC_FREE( p->pExtra );
    ABC_FREE( p );
}